

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddTapScriptSign_Test::TestBody
          (cfdcapi_elements_transaction_AddTapScriptSign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  long *expected_predicate_value;
  undefined1 uVar4;
  undefined1 uVar5;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  int64_t in_stack_000000c8;
  void *in_stack_000000d0;
  void *in_stack_000000d8;
  char *in_stack_000000f0;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  char *tx_string;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char *schnorr_signature;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *tx_string1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *exp_sighash;
  char *sighash;
  AssertionResult gtest_ar_5;
  char *scriptsig_template;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int64_t fee_amount;
  int64_t amount2;
  int64_t amount;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *tx_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t out_point_vout;
  char *out_point_txid;
  char *genesis_block_hash;
  char *asset;
  int sighash_type;
  int net_type;
  char *control_block;
  char *tap_leaf_hash;
  char *address;
  char *redeem_script;
  char *schnorr_pubkey;
  char *privkey;
  undefined1 in_stack_00000d1f;
  int in_stack_00000d20;
  uint32_t in_stack_00000d24;
  char *in_stack_00000d28;
  void *in_stack_00000d30;
  void *in_stack_00000d38;
  char *in_stack_00000d50;
  char *in_stack_00000d58;
  char *in_stack_00000d60;
  uint32_t in_stack_00000d68;
  char *in_stack_00000d70;
  char **in_stack_00000d78;
  undefined1 in_stack_000014ff;
  char *in_stack_00001500;
  int64_t in_stack_00001508;
  uint32_t in_stack_00001514;
  char *in_stack_00001518;
  void *in_stack_00001520;
  void *in_stack_00001528;
  char *in_stack_00001540;
  char *in_stack_00001548;
  char *in_stack_00001550;
  char *in_stack_00001558;
  char *in_stack_00001560;
  char *in_stack_00001568;
  char *in_stack_00001570;
  bool *in_stack_fffffffffffff998;
  AssertionResult *in_stack_fffffffffffff9a0;
  int *piVar6;
  CfdErrorCode *in_stack_fffffffffffff9a8;
  CfdErrorCode *lhs;
  char *in_stack_fffffffffffff9b0;
  undefined4 uVar7;
  void **in_stack_fffffffffffff9b8;
  char *pcVar8;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  void *in_stack_fffffffffffffb30;
  void *in_stack_fffffffffffffb38;
  AssertionResult *this_00;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_424;
  char *in_stack_fffffffffffffbe0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbe8;
  AssertHelper in_stack_fffffffffffffbf0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbf8;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  char *local_3a0;
  AssertHelper local_398;
  Message local_390;
  undefined4 local_384;
  AssertionResult local_380;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  undefined4 local_2ec;
  char **in_stack_fffffffffffffd18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  AssertHelper in_stack_fffffffffffffd30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd38;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  char *local_288;
  AssertHelper local_280;
  Message local_278;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_24c;
  AssertionResult local_248;
  char *local_238;
  char *local_230;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  char *local_200;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  void **in_stack_fffffffffffffe68;
  AssertHelper in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe7c;
  uint32_t in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  void *in_stack_fffffffffffffe88;
  string local_168 [13];
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  AssertHelper in_stack_fffffffffffffeb8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  AssertionResult local_130;
  AssertHelper local_120;
  int in_stack_fffffffffffffee8;
  AssertionResult local_108;
  long local_f8;
  string local_f0 [16];
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff34;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  AssertionResult local_80;
  int local_6c;
  long local_68;
  undefined4 local_5c;
  char *local_58;
  char *local_50;
  CfdErrorCode *local_48;
  undefined4 local_40;
  undefined4 local_3c;
  char *local_38;
  CfdErrorCode *local_30;
  int *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_10 = "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  local_18 = "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb";
  local_20 = "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac";
  local_28 = (int *)0x817266;
  local_30 = (CfdErrorCode *)0x88596a;
  local_38 = 
  "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
  ;
  local_3c = 0xb;
  local_40 = 1;
  local_48 = (CfdErrorCode *)0x805563;
  local_50 = "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f";
  local_58 = "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64";
  local_5c = 0;
  local_68 = 0;
  local_6c = CfdCreateHandle(in_stack_fffffffffffff9b8);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
             (int *)in_stack_fffffffffffff9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x370952);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x93d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x3709b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x370a0a);
  uVar4 = local_68 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,(type *)0x370a3e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff48);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&stack0xffffffffffffff48,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x93e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff30,(Message *)&stack0xffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
    std::__cxx11::string::~string(local_f0);
    testing::Message::~Message((Message *)0x370b3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x370bb5);
  local_f8 = 0;
  expected_predicate_value = &local_f8;
  local_6c = CfdInitializeTransaction
                       (in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                        in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                        (char *)in_stack_fffffffffffffe70.data_,in_stack_fffffffffffffe68);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
             (int *)in_stack_fffffffffffff9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffee8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x370c9f);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x942,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&stack0xfffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x370d02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x370d57);
  uVar5 = local_f8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,(type *)0x370d8b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffec0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_168,(internal *)&local_130,(AssertionResult *)"(NULL == tx_handle)",
               "true","false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffeb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x943,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffeb8,(Message *)&stack0xfffffffffffffec0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb8);
    std::__cxx11::string::~string(local_168);
    testing::Message::~Message((Message *)0x370e87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x370f02);
  if (local_6c == 0) {
    local_6c = CfdSetConfidentialTxGenesisBlockHashByHandle
                         (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                          (char *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe88);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x370fe1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x947,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe70,(Message *)&stack0xfffffffffffffe78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe70);
      testing::Message::~Message((Message *)0x371044);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37109c);
    local_1a0 = 0x9502f130;
    local_1a8 = 1000;
    local_6c = CfdAddConfidentialTxOutput
                         (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                          in_stack_000000b8,in_stack_000000b0,in_stack_000000f0);
    local_1bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3711be);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x94e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x371221);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x371279);
    local_6c = CfdAddConfidentialTxOutput
                         (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                          in_stack_000000b8,in_stack_000000b0,in_stack_000000f0);
    local_1e4 = 0;
    this_00 = &local_1e0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x371362);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x951,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3713c5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37141d);
    local_200 = 
    "4cc7411e73828840df9d2ec76b938af654c9c32e5e2ef4a97531ced1e2a20fc7fcc89a821ea823f38e4d592fddbd929374d116d1c49596bc6dc02b365d455c98223cb00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
    ;
    pcVar8 = "";
    pcVar2 = "";
    piVar6 = local_28;
    lhs = local_48;
    local_6c = CfdSetConfidentialTxUtxoDataByHandle
                         (in_stack_00001528,in_stack_00001520,in_stack_00001518,in_stack_00001514,
                          in_stack_00001508,in_stack_00001500,in_stack_00001540,in_stack_00001548,
                          in_stack_00001550,in_stack_00001558,in_stack_00001560,in_stack_00001568,
                          in_stack_00001570,(bool)in_stack_000014ff);
    local_214 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>(pcVar8,pcVar2,lhs,piVar6);
    uVar7 = (undefined4)((ulong)pcVar2 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x371558);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x957,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x3715bb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x371613);
    local_230 = (char *)0x0;
    local_238 = "c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02";
    in_stack_fffffffffffff9b8 = (void **)0x9ee1bc;
    piVar6 = (int *)0x9ee1bc;
    pcVar2 = "";
    pcVar8 = (char *)CONCAT44(uVar7,0xffffffff);
    in_stack_fffffffffffff9a8 = local_30;
    local_6c = CfdCreateSighashByHandle
                         (in_stack_00000d38,in_stack_00000d30,in_stack_00000d28,in_stack_00000d24,
                          in_stack_00000d20,(bool)in_stack_00000d1f,in_stack_00000d50,
                          in_stack_00000d58,in_stack_00000d60,in_stack_00000d68,in_stack_00000d70,
                          in_stack_00000d78);
    local_24c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,pcVar8,in_stack_fffffffffffff9a8,piVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x371745);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x95f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x3717a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3717fd);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_270,"exp_sighash","sighash",local_238,local_230);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x37189f);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x960,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message((Message *)0x371902);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37195a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff9a8);
    local_288 = (char *)0x0;
    local_6c = CfdFinalizeTransaction(piVar6,pcVar2,(char **)0x371990);
    local_29c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,pcVar8,in_stack_fffffffffffff9a8,piVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x371a44);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x965,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x371aa7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x371afc);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c0,
                 "\"020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000\""
                 ,"tx_string1",
                 "020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000"
                 ,local_288);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffd38);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x371bab);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffd30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x967,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffd30,(Message *)&stack0xfffffffffffffd38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd30);
        testing::Message::~Message((Message *)0x371c0e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x371c63);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff9a8);
    }
    pcVar2 = (char *)0x0;
    if (local_6c == 0) {
      local_6c = CfdSignSchnorr(in_stack_fffffffffffffd38.ptr_,
                                (char *)in_stack_fffffffffffffd30.data_,(char *)0x0,
                                (char *)in_stack_fffffffffffffd20.ptr_,in_stack_fffffffffffffd18);
      local_2ec = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff9b8,pcVar8,in_stack_fffffffffffff9a8,piVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffd18);
      if (!bVar1) {
        testing::Message::Message(&local_2f8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x371d6c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x96f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
        testing::internal::AssertHelper::~AssertHelper(&local_300);
        testing::Message::~Message((Message *)0x371dcf);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x371e24);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_310,
                 "\"e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0\""
                 ,"schnorr_signature",
                 "e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0"
                 ,pcVar2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
      if (!bVar1) {
        testing::Message::Message(&local_318);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x371ec5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x970,pcVar2);
        testing::internal::AssertHelper::operator=(&local_320,&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_320);
        testing::Message::~Message((Message *)0x371f28);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x371f80);
      local_6c = CfdVerifySchnorr(in_stack_fffffffffffffbf8.ptr_,
                                  (char *)in_stack_fffffffffffffbf0.data_,
                                  (char *)in_stack_fffffffffffffbe8.ptr_,in_stack_fffffffffffffbe0);
      local_334 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff9b8,pcVar8,in_stack_fffffffffffff9a8,piVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x372059);
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x973,pcVar2);
        testing::internal::AssertHelper::operator=(&local_348,&local_340);
        testing::internal::AssertHelper::~AssertHelper(&local_348);
        testing::Message::~Message((Message *)0x3720bc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x372111);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff9a8);
    }
    piVar6 = (int *)CONCAT44((int)((ulong)piVar6 >> 0x20),local_40);
    in_stack_fffffffffffff9b0 = (char *)CONCAT44((int)((ulong)pcVar8 >> 0x20),1);
    in_stack_fffffffffffff9a8 =
         (CfdErrorCode *)((ulong)in_stack_fffffffffffff9a8 & 0xffffffff00000000);
    local_6c = CfdAddTxSignByHandle
                         ((void *)CONCAT17(uVar5,in_stack_fffffffffffffec8),
                          in_stack_fffffffffffffec0.ptr_,(char *)in_stack_fffffffffffffeb8.data_,
                          in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                          (char *)in_stack_fffffffffffffea8,(bool)in_stack_fffffffffffffea7,
                          in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffea6,
                          (bool)in_stack_fffffffffffffea5);
    local_35c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,piVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x372228);
      testing::internal::AssertHelper::AssertHelper
                (&local_370,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x97e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_370,&local_368);
      testing::internal::AssertHelper::~AssertHelper(&local_370);
      testing::Message::~Message((Message *)0x37228b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3722e3);
    in_stack_fffffffffffff9a0 = (AssertionResult *)0x9ee1bc;
    pcVar2 = local_38;
    local_6c = CfdAddTaprootSignByHandle
                         (in_stack_ffffffffffffff48,
                          (void *)CONCAT17(uVar4,in_stack_ffffffffffffff40),
                          (char *)in_stack_ffffffffffffff38.ptr_,in_stack_ffffffffffffff34,
                          (char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                          (char *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff68);
    local_384 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x3723dc);
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x983,pcVar8);
      testing::internal::AssertHelper::operator=(&local_398,&local_390);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::Message::~Message((Message *)0x37243f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x372497);
    local_3a0 = (char *)0x0;
    local_6c = CfdFinalizeTransaction(in_stack_fffffffffffff9a0,pcVar2,(char **)0x3724c0);
    local_3b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x372574);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x987,pcVar8);
      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      testing::Message::~Message((Message *)0x3725d7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x37262c);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3d8,
                 "\"020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000\""
                 ,"tx_string",
                 "020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000"
                 ,local_3a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar1) {
        testing::Message::Message(&local_3e0);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x3726d5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x989,pcVar8);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        testing::Message::~Message((Message *)0x372732);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x372787);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff9a8);
    }
    local_6c = CfdFreeTransactionHandle(in_stack_fffffffffffff9a0,pcVar2);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
               ,(int *)in_stack_fffffffffffff9a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffbf8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x372853);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffbf0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x98e,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffbf0,(Message *)&stack0xfffffffffffffbf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbf0);
      testing::Message::~Message((Message *)0x3728b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x372905);
  }
  local_6c = CfdFreeHandle(in_stack_fffffffffffff9a8);
  local_424 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
             (int *)in_stack_fffffffffffff9a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbe0);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3729bc);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x992,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x372a19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x372a6e);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddTapScriptSign) {
  const char* privkey =
    "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  // const char* pubkey = "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb";
  // bool is_parity = true;
  const char* schnorr_pubkey = "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb";

  const char* redeem_script =
    "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac";
  // const char* const nodes[] = {
  //   "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
  //   "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
  // };

  // see: TapscriptTreeElements
  // const char* witness_program = "874c7545f839a7565d553ae29d1eba93cf3bee27685f570c6de5b05add657e2b";
  // const char* locking_script = "5120" "874c7545f839a7565d553ae29d1eba93cf3bee27685f570c6de5b05add657e2b";
  const char* address = "ert1psax8230c8xn4vh248t3f6846j08nhm38dp04wrrdukc94ht90c4skyhl4r";
  const char* tap_leaf_hash = "56bf7b05d6a4a76be602450e00086dc79db2a46e17df6bbe2a9ac3d127213624";
  const char* control_block = "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";

  int net_type = kCfdNetworkElementsRegtest;
  int sighash_type = kCfdSigHashAll;
  const char* asset = "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  const char* genesis_block_hash = "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f";
  const char* out_point_txid = "9ac3cfc55c5bab621d71e7132b06f60dafc7a5cc340cbcacc7d1d573bb938f64";
  uint32_t out_point_vout = 0;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tx_handle = nullptr;
  ret = CfdInitializeTransaction(handle, net_type, 2, 0, "", &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == tx_handle));
  if (ret == kCfdSuccess) {
    ret = CfdSetConfidentialTxGenesisBlockHashByHandle(
      handle, tx_handle, genesis_block_hash);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t amount = 2499999000;
    int64_t amount2 = 2499998000;
    int64_t fee_amount = amount - amount2;
    ret = CfdAddConfidentialTxOutput(handle, tx_handle, amount2,
      "ert1qze8fshg0eykfy7nxcr96778xagufv2w4j3mct0", "", asset, "");
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddConfidentialTxOutput(handle, tx_handle, fee_amount,
      "", "", asset, "");
    EXPECT_EQ(kCfdSuccess, ret);

    const char* scriptsig_template = "4cc7" "411e73828840df9d2ec76b938af654c9c32e5e2ef4a97531ced1e2a20fc7fcc89a821ea823f38e4d592fddbd929374d116d1c49596bc6dc02b365d455c98223cb00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
    ret = CfdSetConfidentialTxUtxoDataByHandle(handle, tx_handle,
      out_point_txid, out_point_vout, amount, "", "",
      address, asset, "", "", "", scriptsig_template, true);
    EXPECT_EQ(kCfdSuccess, ret);

    char* sighash = NULL;
    const char* exp_sighash = "c3f788643ce43074dee15890bccb6e77bbb5481ab9b3443b7041699a0758de02";
    ret = CfdCreateSighashByHandle(handle, tx_handle,
      out_point_txid, out_point_vout, sighash_type, false, "",
      "", tap_leaf_hash, kCfdCodeSeparatorPositionDefault,
      "", &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ(exp_sighash, sighash);
    CfdFreeStringBuffer(sighash);
    {
      char* tx_string1 = NULL;
      ret = CfdFinalizeTransaction(handle, tx_handle, &tx_string1);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("020000000001648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000", tx_string1);
        CfdFreeStringBuffer(tx_string1);
      }
    }

    char* schnorr_signature = NULL;
    if (ret == kCfdSuccess) {
      ret = CfdSignSchnorr(handle, exp_sighash, privkey, "", &schnorr_signature);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0", schnorr_signature);

      ret = CfdVerifySchnorr(handle, schnorr_signature, exp_sighash, schnorr_pubkey);
      EXPECT_EQ(kCfdSuccess, ret);

      CfdFreeStringBuffer(schnorr_signature);
    }

    // add witness stack
    ret = CfdAddTxSignByHandle(handle, tx_handle,
      out_point_txid, out_point_vout,
      kCfdTaproot,
      "e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa0" "01",
      false, sighash_type, false, true);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTaprootSignByHandle(handle, tx_handle,
      out_point_txid, out_point_vout,
      "", redeem_script, control_block, "");
    EXPECT_EQ(kCfdSuccess, ret);

    char* tx_string = NULL;
    ret = CfdFinalizeTransaction(handle, tx_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("020000000101648f93bb73d5d1c7acbc0c34cca5c7af0df6062b13e7711d62ab5b5cc5cfc39a0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f13000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e800000000000000000341e15d320eaca60bb7492c927eee15cac0c5287811e208e8bd59dea59e50bdc062acd490f4daf201f2cfc8140774a34106c3a9b42165b7b5b23376a39771b6cfa00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d540000000000", tx_string);
      CfdFreeStringBuffer(tx_string);
    }

    ret = CfdFreeTransactionHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}